

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall btCollisionWorld::debugDrawWorld(btCollisionWorld *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  btDispatcher *pbVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  btVector3 *pbVar6;
  btVector3 *pbVar7;
  undefined4 extraout_var_04;
  btCollisionObject **ppbVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  btCollisionShape *pbVar9;
  btTransform *pbVar10;
  btDispatcherInfo *pbVar11;
  btCollisionShape *pbVar12;
  btCollisionWorld *in_RDI;
  btScalar bVar13;
  btVector3 maxAabb2;
  btVector3 minAabb2;
  btVector3 contactThreshold;
  btVector3 colorvec;
  btVector3 maxAabb;
  btVector3 minAabb;
  btVector3 color;
  btCollisionObject *colObj;
  int i_1;
  btManifoldPoint *cp;
  int j;
  int numContacts;
  btPersistentManifold *contactManifold;
  int i;
  int numManifolds;
  DefaultColors defaultColors;
  btTransform *in_stack_fffffffffffffe80;
  btVector3 local_140;
  btVector3 local_130;
  btVector3 local_120;
  undefined8 local_110;
  undefined8 local_108;
  btVector3 local_100;
  btVector3 local_f0;
  btScalar local_e0;
  btScalar local_dc;
  btScalar local_d8;
  btVector3 local_d4;
  btScalar local_c4;
  btScalar local_c0;
  btScalar local_bc;
  btVector3 local_b8;
  btCollisionObject *local_a8;
  int local_9c;
  btManifoldPoint *local_98;
  int local_90;
  int local_8c;
  btPersistentManifold *local_88;
  uint local_80;
  int local_7c;
  btScalar local_78 [2];
  btScalar local_70 [2];
  btScalar local_68 [2];
  btScalar local_60 [2];
  btScalar local_58 [2];
  btScalar local_50 [2];
  btScalar local_48 [2];
  btScalar local_40 [2];
  btScalar local_38 [2];
  btScalar local_30 [2];
  undefined8 local_28;
  undefined8 local_20;
  undefined1 auStack_18 [24];
  
  iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))(local_78);
    iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x70))();
    if (((uVar3 & 8) != 0) && (pbVar5 = getDispatcher(in_RDI), pbVar5 != (btDispatcher *)0x0)) {
      pbVar5 = getDispatcher(in_RDI);
      local_7c = (*pbVar5->_vptr_btDispatcher[9])();
      for (local_80 = 0; (int)local_80 < local_7c; local_80 = local_80 + 1) {
        pbVar5 = getDispatcher(in_RDI);
        iVar2 = (*pbVar5->_vptr_btDispatcher[10])(pbVar5,(ulong)local_80);
        local_88 = (btPersistentManifold *)CONCAT44(extraout_var_02,iVar2);
        local_8c = btPersistentManifold::getNumContacts(local_88);
        for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
          local_98 = btPersistentManifold::getContactPoint(local_88,local_90);
          iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
          pbVar6 = &local_98->m_positionWorldOnB;
          pbVar7 = &local_98->m_normalWorldOnB;
          bVar13 = btManifoldPoint::getDistance(local_98);
          iVar4 = btManifoldPoint::getLifeTime(local_98);
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                    (bVar13,(long *)CONCAT44(extraout_var_03,iVar2),pbVar6,pbVar7,iVar4,auStack_18);
        }
      }
    }
    iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x70))();
    if ((uVar3 & 3) != 0) {
      for (local_9c = 0; iVar2 = local_9c,
          iVar4 = btAlignedObjectArray<btCollisionObject_*>::size(&in_RDI->m_collisionObjects),
          iVar2 < iVar4; local_9c = local_9c + 1) {
        ppbVar8 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                            (&in_RDI->m_collisionObjects,local_9c);
        local_a8 = *ppbVar8;
        uVar3 = btCollisionObject::getCollisionFlags(local_a8);
        if ((uVar3 & 0x20) == 0) {
          iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
          if (CONCAT44(extraout_var_05,iVar2) != 0) {
            iVar2 = (*in_RDI->_vptr_btCollisionWorld[5])();
            uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x70))();
            if ((uVar3 & 1) != 0) {
              local_bc = 0.4;
              local_c0 = 0.4;
              local_c4 = 0.4;
              btVector3::btVector3(&local_b8,&local_bc,&local_c0,&local_c4);
              iVar2 = btCollisionObject::getActivationState(local_a8);
              switch(iVar2) {
              case 1:
                local_b8.m_floats[0] = local_78[0];
                local_b8.m_floats[1] = local_78[1];
                local_b8.m_floats[2] = local_70[0];
                local_b8.m_floats[3] = local_70[1];
                break;
              case 2:
                local_b8.m_floats[0] = local_68[0];
                local_b8.m_floats[1] = local_68[1];
                local_b8.m_floats[2] = local_60[0];
                local_b8.m_floats[3] = local_60[1];
                break;
              case 3:
                local_b8.m_floats[0] = local_58[0];
                local_b8.m_floats[1] = local_58[1];
                local_b8.m_floats[2] = local_50[0];
                local_b8.m_floats[3] = local_50[1];
                break;
              case 4:
                local_b8.m_floats[0] = local_48[0];
                local_b8.m_floats[1] = local_48[1];
                local_b8.m_floats[2] = local_40[0];
                local_b8.m_floats[3] = local_40[1];
                break;
              case 5:
                local_b8.m_floats[0] = local_38[0];
                local_b8.m_floats[1] = local_38[1];
                local_b8.m_floats[2] = local_30[0];
                local_b8.m_floats[3] = local_30[1];
                break;
              default:
                local_d8 = 0.3;
                local_dc = 0.3;
                local_e0 = 0.3;
                btVector3::btVector3(&local_d4,&local_d8,&local_dc,&local_e0);
                local_b8.m_floats[0] = local_d4.m_floats[0];
                local_b8.m_floats[1] = local_d4.m_floats[1];
                local_b8.m_floats[2] = local_d4.m_floats[2];
                local_b8.m_floats[3] = local_d4.m_floats[3];
              }
              in_stack_fffffffffffffe80 = btCollisionObject::getWorldTransform(local_a8);
              pbVar9 = btCollisionObject::getCollisionShape(local_a8);
              (*in_RDI->_vptr_btCollisionWorld[7])
                        (in_RDI,in_stack_fffffffffffffe80,pbVar9,&local_b8);
            }
          }
          if ((in_RDI->m_debugDrawer != (btIDebugDraw *)0x0) &&
             (uVar3 = (*in_RDI->m_debugDrawer->_vptr_btIDebugDraw[0xe])(), (uVar3 & 2) != 0)) {
            btVector3::btVector3(&local_f0);
            btVector3::btVector3(&local_100);
            local_110 = local_28;
            local_108 = local_20;
            pbVar9 = btCollisionObject::getCollisionShape(local_a8);
            pbVar10 = btCollisionObject::getWorldTransform(local_a8);
            (*pbVar9->_vptr_btCollisionShape[2])(pbVar9,pbVar10,&local_f0,&local_100);
            btVector3::btVector3
                      (&local_120,&gContactBreakingThreshold,&gContactBreakingThreshold,
                       &gContactBreakingThreshold);
            btVector3::operator-=(&local_f0,&local_120);
            btVector3::operator+=(&local_100,&local_120);
            btVector3::btVector3(&local_130);
            btVector3::btVector3(&local_140);
            pbVar11 = getDispatchInfo(in_RDI);
            if (((pbVar11->m_useContinuous & 1U) != 0) &&
               ((iVar2 = btCollisionObject::getInternalType(local_a8), iVar2 == 2 &&
                (bVar1 = btCollisionObject::isStaticOrKinematicObject(local_a8), !bVar1)))) {
              pbVar12 = btCollisionObject::getCollisionShape(local_a8);
              pbVar10 = btCollisionObject::getInterpolationWorldTransform(local_a8);
              (*pbVar12->_vptr_btCollisionShape[2])(pbVar12,pbVar10,&local_130,&local_140);
              btVector3::operator-=(&local_130,&local_120);
              btVector3::operator+=(&local_140,&local_120);
              btVector3::setMin((btVector3 *)in_stack_fffffffffffffe80,(btVector3 *)pbVar9);
              btVector3::setMax((btVector3 *)in_stack_fffffffffffffe80,(btVector3 *)pbVar9);
            }
            (*in_RDI->m_debugDrawer->_vptr_btIDebugDraw[0xf])
                      (in_RDI->m_debugDrawer,&local_f0,&local_100,&local_110);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void	btCollisionWorld::debugDrawWorld()
{
	if (getDebugDrawer())
	{
		btIDebugDraw::DefaultColors defaultColors = getDebugDrawer()->getDefaultColors();

		if ( getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawContactPoints)
		{
		

			if (getDispatcher())
			{
				int numManifolds = getDispatcher()->getNumManifolds();
			
				for (int i=0;i<numManifolds;i++)
				{
					btPersistentManifold* contactManifold = getDispatcher()->getManifoldByIndexInternal(i);
					//btCollisionObject* obA = static_cast<btCollisionObject*>(contactManifold->getBody0());
					//btCollisionObject* obB = static_cast<btCollisionObject*>(contactManifold->getBody1());

					int numContacts = contactManifold->getNumContacts();
					for (int j=0;j<numContacts;j++)
					{
						btManifoldPoint& cp = contactManifold->getContactPoint(j);
						getDebugDrawer()->drawContactPoint(cp.m_positionWorldOnB,cp.m_normalWorldOnB,cp.getDistance(),cp.getLifeTime(),defaultColors.m_contactPoint);
					}
				}
			}
		}

		if ((getDebugDrawer()->getDebugMode() & (btIDebugDraw::DBG_DrawWireframe | btIDebugDraw::DBG_DrawAabb)))
		{
			int i;

			for (  i=0;i<m_collisionObjects.size();i++)
			{
				btCollisionObject* colObj = m_collisionObjects[i];
				if ((colObj->getCollisionFlags() & btCollisionObject::CF_DISABLE_VISUALIZE_OBJECT)==0)
				{
					if (getDebugDrawer() && (getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawWireframe))
					{
						btVector3 color(btScalar(0.4),btScalar(0.4),btScalar(0.4));

						switch(colObj->getActivationState())
						{
						case  ACTIVE_TAG:
							color = defaultColors.m_activeObject; break;
						case ISLAND_SLEEPING:
							color =  defaultColors.m_deactivatedObject;break;
						case WANTS_DEACTIVATION:
							color = defaultColors.m_wantsDeactivationObject;break;
						case DISABLE_DEACTIVATION:
							color = defaultColors.m_disabledDeactivationObject;break;
						case DISABLE_SIMULATION:
							color = defaultColors.m_disabledSimulationObject;break;
						default:
							{
								color = btVector3(btScalar(.3),btScalar(0.3),btScalar(0.3));
							}
						};

						debugDrawObject(colObj->getWorldTransform(),colObj->getCollisionShape(),color);
					}
					if (m_debugDrawer && (m_debugDrawer->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
					{
						btVector3 minAabb,maxAabb;
						btVector3 colorvec = defaultColors.m_aabb;
						colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb,maxAabb);
						btVector3 contactThreshold(gContactBreakingThreshold,gContactBreakingThreshold,gContactBreakingThreshold);
						minAabb -= contactThreshold;
						maxAabb += contactThreshold;

						btVector3 minAabb2,maxAabb2;

						if(getDispatchInfo().m_useContinuous && colObj->getInternalType()==btCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
						{
							colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(),minAabb2,maxAabb2);
							minAabb2 -= contactThreshold;
							maxAabb2 += contactThreshold;
							minAabb.setMin(minAabb2);
							maxAabb.setMax(maxAabb2);
						}

						m_debugDrawer->drawAabb(minAabb,maxAabb,colorvec);
					}
				}
			}
		}
	}
}